

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O3

DdNode * cuddBddMakePrime(DdManager *dd,DdNode *cube,DdNode *f)

{
  uint uVar1;
  int iVar2;
  DdNode *n;
  DdNode *pDVar3;
  DdNode *f_00;
  DdNode *e;
  DdNode *t;
  DdNode *local_40;
  DdNode *local_38;
  
  pDVar3 = dd->one;
  Cudd_Ref(cube);
  uVar1 = *(uint *)((ulong)cube & 0xfffffffffffffffe);
  f_00 = cube;
  if (uVar1 != 0x7fffffff) {
    pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
    do {
      n = Cudd_bddExistAbstract(dd,f_00,dd->vars[uVar1]);
      if (n == (DdNode *)0x0) goto LAB_007fd492;
      Cudd_Ref(n);
      iVar2 = Cudd_bddLeq(dd,n,f);
      if (iVar2 == 0) {
        Cudd_RecursiveDeref(dd,n);
      }
      else {
        Cudd_RecursiveDeref(dd,f_00);
        f_00 = n;
      }
      cuddGetBranches(cube,&local_38,&local_40);
      cube = local_40;
      if ((local_38 != pDVar3) && (cube = local_38, local_40 != pDVar3)) goto LAB_007fd487;
      uVar1 = *(uint *)((ulong)cube & 0xfffffffffffffffe);
    } while (uVar1 != 0x7fffffff);
  }
  if (cube == dd->one) {
    Cudd_Deref(f_00);
  }
  else {
LAB_007fd487:
    Cudd_RecursiveDeref(dd,f_00);
LAB_007fd492:
    f_00 = (DdNode *)0x0;
  }
  return f_00;
}

Assistant:

DdNode *
cuddBddMakePrime(
  DdManager *dd /* manager */,
  DdNode *cube /* cube to be expanded */,
  DdNode *f /* function of which the cube is to be made a prime */)
{
    DdNode *scan;
    DdNode *t, *e;
    DdNode *res = cube;
    DdNode *zero = Cudd_Not(DD_ONE(dd));

    Cudd_Ref(res);
    scan = cube;
    while (!Cudd_IsConstant(scan)) {
        DdNode *reg = Cudd_Regular(scan);
        DdNode *var = dd->vars[reg->index];
        DdNode *expanded = Cudd_bddExistAbstract(dd,res,var);
        if (expanded == NULL) {
            return(NULL);
        }
        Cudd_Ref(expanded);
        if (Cudd_bddLeq(dd,expanded,f)) {
            Cudd_RecursiveDeref(dd,res);
            res = expanded;
        } else {
            Cudd_RecursiveDeref(dd,expanded);
        }
        cuddGetBranches(scan,&t,&e);
        if (t == zero) {
            scan = e;
        } else if (e == zero) {
            scan = t;
        } else {
            Cudd_RecursiveDeref(dd,res);
            return(NULL);       /* cube is not a cube */
        }
    }

    if (scan == DD_ONE(dd)) {
        Cudd_Deref(res);
        return(res);
    } else {
        Cudd_RecursiveDeref(dd,res);
        return(NULL);
    }

}